

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int valueFromExpr(sqlite3 *db,Expr *pExpr,u8 enc,u8 affinity,sqlite3_value **ppVal,
                 ValueNewStat4Ctx *pCtx)

{
  sqlite3_value *pRec;
  sqlite3_value **ppsVar1;
  u8 affinity_00;
  int iVar2;
  Mem *pMVar3;
  size_t sVar4;
  char affinity_01;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  MemValue MVar5;
  long lVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  sqlite3_value *pVal;
  sqlite3_value *local_50;
  undefined4 local_44;
  int local_40;
  undefined4 local_3c;
  sqlite3_value **local_38;
  
  local_50 = (Mem *)0x0;
  for (; (bVar8 = pExpr->op, bVar8 == 0xae || (bVar8 == 0xb5)); pExpr = pExpr->pLeft) {
  }
  if (bVar8 == 0xb0) {
    bVar8 = pExpr->op2;
  }
  pcVar7 = "";
  lVar6 = 1;
  local_38 = ppVal;
  if (bVar8 == 0xad) {
    bVar8 = pExpr->pLeft->op;
    if ((bVar8 | 2) == 0x9b) {
      pcVar7 = "-";
      lVar6 = -1;
      pExpr = pExpr->pLeft;
    }
    else {
      bVar8 = 0xad;
    }
  }
  else if (bVar8 == 0x24) {
    affinity_00 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
    ppsVar1 = local_38;
    iVar2 = valueFromExpr(db,pExpr->pLeft,enc,affinity_00,local_38,pCtx);
    pMVar3 = *ppsVar1;
    if (pMVar3 == (Mem *)0x0) {
      return iVar2;
    }
    sqlite3VdbeMemCast(pMVar3,affinity_00,enc);
    applyAffinity(*ppsVar1,affinity,enc);
    return iVar2;
  }
  local_40 = 0;
  if (bVar8 < 0x9a) {
    if (bVar8 != 0x75) {
      if (bVar8 == 0x79) {
        local_50 = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
        if (local_50 == (Mem *)0x0) {
          local_50 = (Mem *)0x0;
          goto LAB_0016f490;
        }
        local_50->flags = 1;
        local_50->db = db;
        local_50->flags = 1;
        goto LAB_0016f557;
      }
      if (bVar8 != 0x99) goto LAB_0016f557;
    }
  }
  else {
    if (0xa9 < bVar8) {
      if (bVar8 == 0xaa) {
        local_50 = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
        if (local_50 != (Mem *)0x0) {
          local_50->flags = 1;
          local_50->db = db;
          local_50->flags = 4;
          MVar5.i._1_7_ = 0;
          MVar5.i._0_1_ = (pExpr->u).zToken[4] == '\0';
          local_50->u = MVar5;
        }
      }
      else if ((bVar8 == 0xad) &&
              (iVar2 = valueFromExpr(db,pExpr->pLeft,enc,affinity,&local_50,pCtx), pRec = local_50,
              local_50 != (Mem *)0x0 && iVar2 == 0)) {
        sqlite3VdbeMemNumerify(local_50);
        if ((pRec->flags & 8) == 0) {
          (pRec->u).i = -(pRec->u).i;
        }
        else {
          (pRec->u).i = (pRec->u).i ^ 0x8000000000000000;
        }
        applyAffinity(pRec,affinity,enc);
      }
      goto LAB_0016f557;
    }
    if (bVar8 == 0x9a) {
      pMVar3 = (Mem *)sqlite3DbMallocZero(db,0x38);
      if (pMVar3 != (Mem *)0x0) {
        pMVar3->flags = 1;
        pMVar3->db = db;
        pcVar7 = (pExpr->u).zToken;
        local_50 = pMVar3;
        sVar4 = strlen(pcVar7 + 2);
        uVar9 = (uint)sVar4 & 0x3fffffff;
        iVar2 = uVar9 - 1;
        pcVar7 = (char *)sqlite3HexToBlob(db,pcVar7 + 2,iVar2);
        sqlite3VdbeMemSetStr
                  (pMVar3,pcVar7,(ulong)(uint)((int)((uVar9 - (iVar2 >> 0x1f)) + -1) >> 1),'\0',
                   sqlite3OomClear);
        goto LAB_0016f557;
      }
      local_50 = (Mem *)0x0;
      goto LAB_0016f490;
    }
    if (bVar8 != 0x9b) goto LAB_0016f557;
  }
  local_44 = (undefined4)CONCAT71(in_register_00000011,enc);
  local_3c = (int)CONCAT71(in_register_00000009,affinity);
  pMVar3 = (Mem *)sqlite3DbMallocZero(db,0x38);
  local_50 = pMVar3;
  if (pMVar3 != (Mem *)0x0) {
    pMVar3->flags = 1;
    pMVar3->db = db;
    if ((pExpr->flags & 0x800) == 0) {
      pcVar7 = sqlite3MPrintf(db,"%s%s",pcVar7,(pExpr->u).zToken);
      if (pcVar7 == (char *)0x0) goto LAB_0016f490;
      sqlite3VdbeMemSetStr(pMVar3,pcVar7,-1,'\x01',sqlite3OomClear);
    }
    else {
      lVar6 = lVar6 * (pExpr->u).iValue;
      if ((pMVar3->flags & 0x9000) == 0) {
        (pMVar3->u).i = lVar6;
        pMVar3->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(pMVar3,lVar6);
      }
    }
    affinity_01 = 'C';
    if ((char)local_3c != 'A' || (bVar8 & 0xfd) != 0x99) {
      affinity_01 = (char)local_3c;
    }
    applyAffinity(pMVar3,affinity_01,'\x01');
    if ((pMVar3->flags & 0x2c) != 0) {
      pMVar3->flags = pMVar3->flags & 0xfffd;
    }
    if ((u8)local_44 != '\x01') {
      if ((pMVar3->flags & 2) == 0) {
        pMVar3->enc = (u8)local_44;
      }
      else if (pMVar3->enc != (u8)local_44) {
        local_40 = sqlite3VdbeMemTranslate(pMVar3,(u8)local_44);
      }
    }
LAB_0016f557:
    *local_38 = local_50;
    return local_40;
  }
LAB_0016f490:
  sqlite3OomFault(db);
  sqlite3ValueFree(local_50);
  return 7;
}

Assistant:

static int valueFromExpr(
  sqlite3 *db,                    /* The database connection */
  const Expr *pExpr,              /* The expression to evaluate */
  u8 enc,                         /* Encoding to use */
  u8 affinity,                    /* Affinity to use */
  sqlite3_value **ppVal,          /* Write the new value here */
  struct ValueNewStat4Ctx *pCtx   /* Second argument for valueNew() */
){
  int op;
  char *zVal = 0;
  sqlite3_value *pVal = 0;
  int negInt = 1;
  const char *zNeg = "";
  int rc = SQLITE_OK;

  assert( pExpr!=0 );
  while( (op = pExpr->op)==TK_UPLUS || op==TK_SPAN ) pExpr = pExpr->pLeft;
  if( op==TK_REGISTER ) op = pExpr->op2;

  /* Compressed expressions only appear when parsing the DEFAULT clause
  ** on a table column definition, and hence only when pCtx==0.  This
  ** check ensures that an EP_TokenOnly expression is never passed down
  ** into valueFromFunction(). */
  assert( (pExpr->flags & EP_TokenOnly)==0 || pCtx==0 );

  if( op==TK_CAST ){
    u8 aff;
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    aff = sqlite3AffinityType(pExpr->u.zToken,0);
    rc = valueFromExpr(db, pExpr->pLeft, enc, aff, ppVal, pCtx);
    testcase( rc!=SQLITE_OK );
    if( *ppVal ){
      sqlite3VdbeMemCast(*ppVal, aff, enc);
      sqlite3ValueApplyAffinity(*ppVal, affinity, enc);
    }
    return rc;
  }

  /* Handle negative integers in a single step.  This is needed in the
  ** case when the value is -9223372036854775808.
  */
  if( op==TK_UMINUS
   && (pExpr->pLeft->op==TK_INTEGER || pExpr->pLeft->op==TK_FLOAT) ){
    pExpr = pExpr->pLeft;
    op = pExpr->op;
    negInt = -1;
    zNeg = "-";
  }

  if( op==TK_STRING || op==TK_FLOAT || op==TK_INTEGER ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    if( ExprHasProperty(pExpr, EP_IntValue) ){
      sqlite3VdbeMemSetInt64(pVal, (i64)pExpr->u.iValue*negInt);
    }else{
      zVal = sqlite3MPrintf(db, "%s%s", zNeg, pExpr->u.zToken);
      if( zVal==0 ) goto no_mem;
      sqlite3ValueSetStr(pVal, -1, zVal, SQLITE_UTF8, SQLITE_DYNAMIC);
    }
    if( (op==TK_INTEGER || op==TK_FLOAT ) && affinity==SQLITE_AFF_BLOB ){
      sqlite3ValueApplyAffinity(pVal, SQLITE_AFF_NUMERIC, SQLITE_UTF8);
    }else{
      sqlite3ValueApplyAffinity(pVal, affinity, SQLITE_UTF8);
    }
    assert( (pVal->flags & MEM_IntReal)==0 );
    if( pVal->flags & (MEM_Int|MEM_IntReal|MEM_Real) ){
      testcase( pVal->flags & MEM_Int );
      testcase( pVal->flags & MEM_Real );
      pVal->flags &= ~MEM_Str;
    }
    if( enc!=SQLITE_UTF8 ){
      rc = sqlite3VdbeChangeEncoding(pVal, enc);
    }
  }else if( op==TK_UMINUS ) {
    /* This branch happens for multiple negative signs.  Ex: -(-5) */
    if( SQLITE_OK==valueFromExpr(db,pExpr->pLeft,enc,affinity,&pVal,pCtx)
     && pVal!=0
    ){
      sqlite3VdbeMemNumerify(pVal);
      if( pVal->flags & MEM_Real ){
        pVal->u.r = -pVal->u.r;
      }else if( pVal->u.i==SMALLEST_INT64 ){
#ifndef SQLITE_OMIT_FLOATING_POINT
        pVal->u.r = -(double)SMALLEST_INT64;
#else
        pVal->u.r = LARGEST_INT64;
#endif
        MemSetTypeFlag(pVal, MEM_Real);
      }else{
        pVal->u.i = -pVal->u.i;
      }
      sqlite3ValueApplyAffinity(pVal, affinity, enc);
    }
  }else if( op==TK_NULL ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    sqlite3VdbeMemSetNull(pVal);
  }
#ifndef SQLITE_OMIT_BLOB_LITERAL
  else if( op==TK_BLOB ){
    int nVal;
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
    assert( pExpr->u.zToken[1]=='\'' );
    pVal = valueNew(db, pCtx);
    if( !pVal ) goto no_mem;
    zVal = &pExpr->u.zToken[2];
    nVal = sqlite3Strlen30(zVal)-1;
    assert( zVal[nVal]=='\'' );
    sqlite3VdbeMemSetStr(pVal, sqlite3HexToBlob(db, zVal, nVal), nVal/2,
                         0, SQLITE_DYNAMIC);
  }
#endif
#ifdef SQLITE_ENABLE_STAT4
  else if( op==TK_FUNCTION && pCtx!=0 ){
    rc = valueFromFunction(db, pExpr, enc, affinity, &pVal, pCtx);
  }
#endif
  else if( op==TK_TRUEFALSE ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    pVal = valueNew(db, pCtx);
    if( pVal ){
      pVal->flags = MEM_Int;
      pVal->u.i = pExpr->u.zToken[4]==0;
    }
  }

  *ppVal = pVal;
  return rc;

no_mem:
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx==0 || NEVER(pCtx->pParse->nErr==0) )
#endif
    sqlite3OomFault(db);
  sqlite3DbFree(db, zVal);
  assert( *ppVal==0 );
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx==0 ) sqlite3ValueFree(pVal);
#else
  assert( pCtx==0 ); sqlite3ValueFree(pVal);
#endif
  return SQLITE_NOMEM_BKPT;
}